

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_fclose(void *el)

{
  iterator iVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  pointer ppVar4;
  allocator local_a1;
  string local_a0 [32];
  FILE *local_80;
  FILE *f;
  allocator local_59;
  string local_58 [32];
  _Self local_38;
  iterator it;
  char *hd;
  XMLElement *e;
  XMLElement **ep;
  void *el_local;
  
  p_Var3 = (_Base_ptr)get_attr_val((XMLElement **)el,"handle");
  if (p_Var3 == (_Base_ptr)0x0) {
    el_local._4_4_ = 5;
  }
  else {
    it._M_node = p_Var3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)p_Var3,&local_59);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                 *)gCmdMemMap_abi_cxx11_,(key_type *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    f = (FILE *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                       *)gCmdMemMap_abi_cxx11_);
    bVar2 = std::operator==(&local_38,(_Self *)&f);
    if (bVar2) {
      el_local._4_4_ = 7;
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
               ::operator->(&local_38);
      local_80 = (FILE *)(ppVar4->second).data;
      if (local_80 == (FILE *)0x0) {
        el_local._4_4_ = 3;
      }
      else {
        fclose(local_80);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                 ::operator->(&local_38);
        proc_data::clear(&ppVar4->second);
        iVar1 = it;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,(char *)iVar1._M_node,&local_a1);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
        ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                 *)gCmdMemMap_abi_cxx11_,(key_type *)local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        el_local._4_4_ = 0;
      }
    }
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_fclose(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;
    // const char* hd = e->Attribute("handle");
    const char* hd = get_attr_val(ep,"handle");
    if(!hd){
        return proc_xml_err;
    }

    // 确保关闭的句柄存在
    map<string,proc_data>::iterator it = gCmdMemMap.find(hd);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    FILE* f = (FILE*)it->second.data;
    if(!f){
        return proc_exec_err;
    }

    fclose(f);
    it->second.clear();
    gCmdMemMap.erase(hd);

    return proc_success;
}